

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

Compressor *
Imf_2_5::newTileCompressor(Compression c,size_t tileLineSize,size_t numTileLines,Header *hdr)

{
  RleCompressor *in_RCX;
  ZipCompressor *this;
  size_t in_RSI;
  int in_EDI;
  DwaCompressor *unaff_retaddr;
  size_t in_stack_00000048;
  size_t in_stack_00000050;
  Header *in_stack_00000058;
  bool in_stack_00000097;
  size_t in_stack_00000098;
  size_t in_stack_000000a0;
  Header *in_stack_000000a8;
  B44Compressor *in_stack_000000b0;
  unsigned_long in_stack_ffffffffffffff88;
  unsigned_long in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  Header *in_stack_ffffffffffffffb8;
  int in_stack_fffffffffffffff0;
  Header *in_stack_fffffffffffffff8;
  Header *hdr_00;
  
  this = (ZipCompressor *)(ulong)(in_EDI - 1);
  switch(this) {
  case (ZipCompressor *)0x0:
    hdr_00 = (Header *)operator_new(0x28);
    uiMult<unsigned_long>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    RleCompressor::RleCompressor(in_RCX,hdr_00,in_stack_ffffffffffffffa0);
    break;
  case (ZipCompressor *)0x1:
  case (ZipCompressor *)0x2:
    hdr_00 = (Header *)operator_new(0x30);
    ZipCompressor::ZipCompressor
              (this,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case (ZipCompressor *)0x3:
    hdr_00 = (Header *)operator_new(0x58);
    PizCompressor::PizCompressor
              ((PizCompressor *)hdr,in_stack_00000058,in_stack_00000050,in_stack_00000048);
    break;
  case (ZipCompressor *)0x4:
    hdr_00 = (Header *)operator_new(0x40);
    Pxr24Compressor::Pxr24Compressor
              ((Pxr24Compressor *)unaff_retaddr,in_stack_fffffffffffffff8,
               CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_RSI);
    break;
  case (ZipCompressor *)0x5:
    hdr_00 = (Header *)operator_new(0x58);
    B44Compressor::B44Compressor
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000097);
    break;
  case (ZipCompressor *)0x6:
    hdr_00 = (Header *)operator_new(0x58);
    B44Compressor::B44Compressor
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000097);
    break;
  case (ZipCompressor *)0x7:
  case (ZipCompressor *)0x8:
    hdr_00 = (Header *)operator_new(0x128);
    DwaCompressor::DwaCompressor
              (unaff_retaddr,in_stack_fffffffffffffff8,in_EDI,in_stack_fffffffffffffff0,
               (AcCompression)(in_RSI >> 0x20));
    break;
  default:
    hdr_00 = (Header *)0x0;
  }
  return (Compressor *)hdr_00;
}

Assistant:

Compressor *
newTileCompressor (Compression c,
		   size_t tileLineSize,
		   size_t numTileLines,
		   const Header &hdr)
{
    switch (c)
    {
      case RLE_COMPRESSION:

	return new RleCompressor (hdr, uiMult (tileLineSize, numTileLines));

      case ZIPS_COMPRESSION:
      case ZIP_COMPRESSION:

	return new ZipCompressor (hdr, tileLineSize, numTileLines);

      case PIZ_COMPRESSION:

	return new PizCompressor (hdr, tileLineSize, numTileLines);

      case PXR24_COMPRESSION:

	return new Pxr24Compressor (hdr, tileLineSize, numTileLines);

      case B44_COMPRESSION:

	return new B44Compressor (hdr, tileLineSize, numTileLines, false);

      case B44A_COMPRESSION:

	return new B44Compressor (hdr, tileLineSize, numTileLines, true);

      case DWAA_COMPRESSION:
      case DWAB_COMPRESSION:

	return new DwaCompressor (hdr, tileLineSize, numTileLines, 
                               DwaCompressor::DEFLATE);

      default:

	return 0;
    }
}